

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O3

void __thiscall tst_XmlModelSerialiser::basicSaveLoadNested(tst_XmlModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  bool bVar1;
  char cVar2;
  __atomic_base<int> _Var3;
  undefined8 *puVar4;
  QXmlStreamWriter writeNestedStream;
  QXmlStreamReader readNestedStream;
  QTemporaryFile serialisedXmlNested;
  XmlModelSerialiser serialiser;
  undefined1 auStack_88 [16];
  long local_78 [2];
  QMetaTypeInterface *local_68 [3];
  QArrayData *local_50;
  char16_t *local_48;
  QAbstractItemModel *pQStack_40;
  QModelIndex local_38;
  
  local_68[0] = &QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType;
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::idHelper();
  }
  puVar4 = (undefined8 *)QTest::qData("sourceModel",_Var3._M_i);
  a = (QAbstractItemModel *)*puVar4;
  local_68[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var3._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var3._M_i = QMetaType::idHelper();
  }
  puVar4 = (undefined8 *)QTest::qData("destinationModel",_Var3._M_i);
  b = (QAbstractItemModel *)*puVar4;
  XmlModelSerialiser::XmlModelSerialiser((XmlModelSerialiser *)local_68,a,(QObject *)0x0);
  AbstractModelSerialiser::addRoleToSave((int)(XmlModelSerialiser *)local_68);
  QTemporaryFile::QTemporaryFile((QTemporaryFile *)local_78);
  bVar1 = (bool)(**(code **)(local_78[0] + 0x68))(local_78,3);
  cVar2 = QTest::qVerify(bVar1,"serialisedXmlNested.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                         ,0x49);
  if (cVar2 != '\0') {
    QXmlStreamWriter::QXmlStreamWriter((QXmlStreamWriter *)auStack_88,(QIODevice *)local_78);
    QXmlStreamWriter::writeStartDocument();
    local_50 = (QArrayData *)0x0;
    local_48 = L"NestForModel";
    pQStack_40 = (QAbstractItemModel *)0xc;
    QXmlStreamWriter::writeStartElement((QString *)auStack_88);
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,8);
      }
    }
    XmlModelSerialiser::setPrintStartDocument(SUB81(local_68,0));
    bVar1 = (bool)XmlModelSerialiser::saveModel((QXmlStreamWriter *)local_68);
    cVar2 = QTest::qVerify(bVar1,"serialiser.saveModel(writeNestedStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                           ,0x4e);
    if (cVar2 != '\0') {
      QXmlStreamWriter::writeEndElement();
      bVar1 = (bool)QFileDevice::seek((longlong)local_78);
      cVar2 = QTest::qVerify(bVar1,"serialisedXmlNested.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                             ,0x50);
      if (cVar2 != '\0') {
        QXmlStreamReader::QXmlStreamReader
                  ((QXmlStreamReader *)(auStack_88 + 8),(QIODevice *)local_78);
        AbstractModelSerialiser::setModel((QAbstractItemModel *)local_68);
        bVar1 = (bool)XmlModelSerialiser::loadModel((QXmlStreamReader *)local_68);
        cVar2 = QTest::qVerify(bVar1,"serialiser.loadModel(readNestedStream)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                               ,0x53);
        if (cVar2 != '\0') {
          QFileDevice::close();
          local_50 = (QArrayData *)0xffffffffffffffff;
          local_48 = (char16_t *)0x0;
          pQStack_40 = (QAbstractItemModel *)0x0;
          local_38.r = -1;
          local_38.c = -1;
          local_38.i = 0;
          local_38.m = (QAbstractItemModel *)0x0;
          tst_SerialiserCommon::checkModelEqual
                    (&this->super_tst_SerialiserCommon,a,b,(QModelIndex *)&local_50,&local_38,true);
          QObject::deleteLater();
        }
        QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)(auStack_88 + 8));
      }
    }
    QXmlStreamWriter::~QXmlStreamWriter((QXmlStreamWriter *)auStack_88);
  }
  QTemporaryFile::~QTemporaryFile((QTemporaryFile *)local_78);
  XmlModelSerialiser::~XmlModelSerialiser((XmlModelSerialiser *)local_68);
  return;
}

Assistant:

void tst_XmlModelSerialiser::basicSaveLoadNested()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile serialisedXmlNested;
    QVERIFY(serialisedXmlNested.open());
    QXmlStreamWriter writeNestedStream(&serialisedXmlNested);
    writeNestedStream.writeStartDocument();
    writeNestedStream.writeStartElement(QStringLiteral("NestForModel"));
    serialiser.setPrintStartDocument(false);
    QVERIFY(serialiser.saveModel(writeNestedStream));
    writeNestedStream.writeEndElement(); // NestForModel
    QVERIFY(serialisedXmlNested.seek(0));
    QXmlStreamReader readNestedStream(&serialisedXmlNested);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readNestedStream));
    serialisedXmlNested.close();
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}